

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O1

TEmitBufferAllocation * __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::NewAllocation(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
                *this,size_t bytes,ushort pdataCount,ushort xdataSize,
               bool canAllocInPreReservedHeapPageSegment,bool isAnyJittedCode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Allocation *pAVar4;
  TEmitBufferAllocation *pTVar5;
  Allocation *pAVar6;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_00;
  undefined1 local_58 [8];
  AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
  allocatedMemory;
  bool local_31 [8];
  bool isAllJITCodeInPreReservedRegion;
  
  bVar2 = CCLock::IsLocked(&(this->criticalSection).super_CCLock);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x97,"(this->criticalSection.IsLocked())","this->criticalSection.IsLocked()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_31[0] = true;
  this_00 = &this->allocationHeap;
  allocatedMemory._allocationHeap._4_4_ = (uint)isAnyJittedCode;
  pAVar4 = Memory::CustomHeap::
           Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::Alloc
                     (this_00,bytes,pdataCount,xdataSize,canAllocInPreReservedHeapPageSegment,
                      isAnyJittedCode,local_31);
  if (pAVar4 == (Allocation *)0x0) {
    JsUtil::ExternalApi::RecoverUnusedMemory();
    pAVar4 = Memory::CustomHeap::
             Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::Alloc
                       (this_00,bytes,pdataCount,xdataSize,canAllocInPreReservedHeapPageSegment,
                        SUB41(allocatedMemory._allocationHeap._4_4_,0),local_31);
  }
  if (pAVar4 != (Allocation *)0x0) {
    pAVar4->field_0x28 = pAVar4->field_0x28 | 1;
    local_58 = (undefined1  [8])pAVar4;
    allocatedMemory._heapAllocation = (Allocation *)this_00;
    if (DAT_015d346a == '\x01') {
      Output::Trace(CustomHeapPhase,L"New allocation: 0x%p, size: %p\n",pAVar4->address,pAVar4->size
                   );
    }
    pTVar5 = (TEmitBufferAllocation *)new<Memory::ArenaAllocator>(0x28,this->allocator,0x366bee);
    pTVar5->bytesCommitted = pAVar4->size;
    pAVar6 = AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
             ::Detach((AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                       *)local_58);
    pTVar5->allocation = pAVar6;
    pTVar5->bytesUsed = 0;
    pTVar5->nextAllocation = this->allocations;
    pTVar5->recorded = false;
    pTVar5->inPrereservedRegion = local_31[0];
    this->allocations = pTVar5;
    this->totalBytesCommitted = this->totalBytesCommitted + pAVar4->size;
    AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
    ~AutoCustomHeapPointer
              ((AutoCustomHeapPointer<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                *)local_58);
    return pTVar5;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

EmitBufferAllocation<TAlloc, TPreReservedAlloc> *
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::NewAllocation(size_t bytes, ushort pdataCount, ushort xdataSize, bool canAllocInPreReservedHeapPageSegment, bool isAnyJittedCode)
{
    FAULTINJECT_MEMORY_THROW(_u("JIT"), bytes);

    Assert(this->criticalSection.IsLocked());

    bool isAllJITCodeInPreReservedRegion = true;
    CustomHeap::Allocation* heapAllocation = this->allocationHeap.Alloc(bytes, pdataCount, xdataSize, canAllocInPreReservedHeapPageSegment, isAnyJittedCode, &isAllJITCodeInPreReservedRegion);

    if (heapAllocation  == nullptr)
    {
        if (!JITManager::GetJITManager()->IsJITServer())
        {
            // This is used in interpreter scenario, thus we need to try to recover memory, if possible.
            // Can't simply throw as in JIT scenario, for which throw is what we want in order to give more mem to interpreter.
            JsUtil::ExternalApi::RecoverUnusedMemory();
            heapAllocation = this->allocationHeap.Alloc(bytes, pdataCount, xdataSize, canAllocInPreReservedHeapPageSegment, isAnyJittedCode, &isAllJITCodeInPreReservedRegion);
        }
    }

    if (heapAllocation  == nullptr)
    {
        Js::Throw::OutOfMemory();
    }

#if DBG
    heapAllocation->isAllocationUsed = true;
#endif

    AutoCustomHeapPointer<TAlloc, TPreReservedAlloc> allocatedMemory(&this->allocationHeap, heapAllocation);
    VerboseHeapTrace(_u("New allocation: 0x%p, size: %p\n"), heapAllocation->address, heapAllocation->size);
    TEmitBufferAllocation * allocation = AnewStruct(this->allocator, TEmitBufferAllocation);

    allocation->bytesCommitted = heapAllocation->size;
    allocation->allocation = allocatedMemory.Detach();
    allocation->bytesUsed = 0;
    allocation->nextAllocation = this->allocations;
    allocation->recorded = false;
    allocation->inPrereservedRegion = isAllJITCodeInPreReservedRegion;

    this->allocations = allocation;

#if DBG_DUMP
    this->totalBytesCommitted += heapAllocation->size;
#endif

    return allocation;
}